

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O3

string * ANSrfold<3u>::name_abi_cxx11_(void)

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  string *in_RDI;
  ulong uVar4;
  string __str;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ANSrfold-","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  *(undefined1 *)local_58 = 0x33;
  uVar4 = 0xf;
  if (local_38 != local_28) {
    uVar4 = local_28[0];
  }
  if (uVar4 < (ulong)(local_50 + local_30)) {
    uVar4 = 0xf;
    if (local_58 != local_48) {
      uVar4 = local_48[0];
    }
    if ((ulong)(local_50 + local_30) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
      goto LAB_00145bcf;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_00145bcf:
  psVar1 = puVar3 + 2;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar2 = puVar3[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*puVar3;
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
  }
  in_RDI->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

static std::string name()
    {
        return std::string("ANSrfold-") + std::to_string(fidelity);
    }